

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O1

void google::protobuf::compiler::java::GenerateLarge
               (Printer *printer,EnumDescriptor *descriptor,
               vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               *canonical_values,
               vector<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*>_>_>
               *aliases,bool immutable_api,Context *context,ClassNameResolver *name_resolver)

{
  ushort *puVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  Nonnull<char_*> pcVar7;
  double dVar8;
  undefined1 auVar9 [16];
  int interface_count;
  int start;
  bool local_1021;
  Printer *local_1020;
  int local_1014;
  Context *local_1010;
  anon_class_1_0_00000001 local_1001;
  char *local_1000;
  size_type local_ff8;
  char local_ff0;
  undefined7 uStack_fef;
  undefined8 uStack_fe8;
  undefined1 **local_fe0;
  char *local_fd8;
  EnumDescriptor *local_fd0;
  Printer *local_fc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc0;
  undefined1 *local_fa0;
  undefined8 local_f98;
  undefined1 local_f90;
  undefined7 uStack_f8f;
  undefined8 uStack_f88;
  undefined1 *local_f80;
  undefined8 local_f78;
  undefined1 local_f70;
  undefined7 uStack_f6f;
  undefined8 uStack_f68;
  char *local_f60;
  size_type local_f58;
  char local_f50;
  undefined7 uStack_f4f;
  undefined8 uStack_f48;
  char *local_f40;
  size_type local_f38;
  char local_f30;
  undefined7 uStack_f2f;
  undefined8 uStack_f28;
  undefined1 *local_f20;
  undefined8 local_f18;
  undefined1 local_f10;
  undefined7 uStack_f0f;
  undefined8 uStack_f08;
  undefined1 *local_f00;
  undefined8 local_ef8;
  undefined1 local_ef0;
  undefined7 uStack_eef;
  undefined8 uStack_ee8;
  undefined1 *local_ee0;
  undefined8 local_ed8;
  undefined1 local_ed0;
  undefined7 uStack_ecf;
  undefined8 uStack_ec8;
  undefined1 *local_ec0;
  undefined8 local_eb8;
  undefined1 local_eb0;
  undefined7 uStack_eaf;
  undefined8 uStack_ea8;
  undefined1 *local_ea0;
  undefined8 local_e98;
  undefined1 local_e90;
  undefined7 uStack_e8f;
  undefined8 uStack_e88;
  undefined1 *local_e80;
  undefined8 local_e78;
  undefined1 local_e70;
  undefined7 uStack_e6f;
  undefined8 uStack_e68;
  undefined1 *local_e60;
  undefined8 local_e58;
  undefined1 local_e50;
  undefined7 uStack_e4f;
  undefined8 uStack_e48;
  undefined1 *local_e40;
  undefined8 local_e38;
  undefined1 local_e30;
  undefined7 uStack_e2f;
  undefined8 uStack_e28;
  undefined1 *local_e20;
  undefined8 local_e18;
  undefined1 local_e10;
  undefined7 uStack_e0f;
  undefined8 uStack_e08;
  undefined1 *local_e00;
  undefined8 local_df8;
  undefined1 local_df0;
  undefined7 uStack_def;
  undefined8 uStack_de8;
  undefined1 *local_de0;
  undefined8 local_dd8;
  undefined1 local_dd0;
  undefined7 uStack_dcf;
  undefined8 uStack_dc8;
  undefined1 *local_dc0;
  undefined8 local_db8;
  undefined1 local_db0;
  undefined7 uStack_daf;
  undefined8 uStack_da8;
  string local_da0;
  string local_d80;
  string local_d60;
  string local_d40;
  string local_d20;
  undefined1 local_d00 [32];
  string local_ce0;
  Printer *local_cc0;
  char *local_cb8;
  undefined1 local_cb0 [16];
  char *local_ca0;
  long local_c98;
  Nonnull<char_*> local_c90;
  char local_c88 [24];
  char acStack_c70 [8];
  Sub local_c68;
  Sub local_bb0;
  undefined1 local_af8 [56];
  code *local_ac0;
  __index_type local_ab8;
  _Alloc_hider local_ab0;
  size_type local_aa8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_aa0;
  bool local_a90;
  bool local_a48;
  undefined1 local_a40 [56];
  code *local_a08;
  __index_type local_a00;
  _Alloc_hider local_9f8;
  size_type local_9f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e8;
  bool local_9d8;
  bool local_990;
  undefined1 local_988 [56];
  code *local_950;
  __index_type local_948;
  _Alloc_hider local_940;
  size_type local_938;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_930;
  bool local_920;
  bool local_8d8;
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined1 local_8c0;
  undefined7 uStack_8bf;
  undefined8 uStack_8b8;
  long *local_8b0;
  undefined8 uStack_8a8;
  code *local_8a0;
  code *local_898;
  undefined1 local_890;
  undefined1 *local_888;
  undefined8 local_880;
  undefined1 local_878 [16];
  undefined1 local_868;
  undefined1 local_820;
  undefined1 *local_818;
  undefined8 local_810;
  undefined1 local_808;
  undefined7 uStack_807;
  undefined8 uStack_800;
  long *local_7f8;
  undefined8 uStack_7f0;
  code *local_7e8;
  code *local_7e0;
  undefined1 local_7d8;
  undefined1 *local_7d0;
  undefined8 local_7c8;
  undefined1 local_7c0 [16];
  undefined1 local_7b0;
  undefined1 local_768;
  undefined1 *local_760;
  undefined8 local_758;
  undefined1 local_750 [8];
  undefined8 uStack_748;
  long *local_740;
  undefined8 uStack_738;
  code *local_730;
  code *local_728;
  undefined1 local_720;
  undefined1 *local_718;
  undefined8 local_710;
  undefined1 local_708 [16];
  undefined1 local_6f8;
  undefined1 local_6b0;
  undefined1 *local_6a8;
  undefined8 local_6a0;
  undefined1 local_698 [8];
  undefined8 uStack_690;
  long *local_688;
  undefined8 uStack_680;
  code *local_678;
  code *local_670;
  undefined1 local_668;
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 local_650 [16];
  undefined1 local_640;
  undefined1 local_5f8;
  undefined1 *local_5f0;
  undefined8 local_5e8;
  undefined1 local_5e0 [8];
  undefined8 uStack_5d8;
  undefined8 *local_5d0;
  undefined8 uStack_5c8;
  code *local_5c0;
  code *local_5b8;
  undefined1 local_5b0;
  undefined1 *local_5a8;
  undefined8 local_5a0;
  undefined1 local_598 [16];
  undefined1 local_588;
  undefined1 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  long *local_518;
  undefined8 uStack_510;
  code *local_508;
  code *local_500;
  undefined1 local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0 [16];
  undefined1 local_4d0;
  undefined1 local_488;
  undefined1 *local_480;
  undefined8 local_478;
  undefined1 local_470 [8];
  undefined8 uStack_468;
  long *local_460;
  undefined8 uStack_458;
  code *local_450;
  code *local_448;
  undefined1 local_440;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  undefined1 local_418;
  undefined1 local_3d0;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [8];
  undefined8 uStack_3b0;
  long *local_3a8;
  undefined8 uStack_3a0;
  code *local_398;
  code *local_390;
  undefined1 local_388;
  undefined1 *local_380;
  undefined8 local_378;
  undefined1 local_370 [16];
  undefined1 local_360;
  undefined1 local_318;
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  long *local_2f0;
  undefined8 uStack_2e8;
  code *local_2e0;
  code *local_2d8;
  undefined1 local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8;
  undefined1 local_260;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  long *local_238;
  undefined8 uStack_230;
  code *local_228;
  code *local_220;
  undefined1 local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [16];
  undefined1 local_1f0;
  undefined1 local_1a8;
  undefined1 *local_1a0;
  undefined8 local_198;
  undefined1 local_190 [8];
  undefined8 uStack_188;
  long *local_180;
  undefined8 uStack_178;
  code *local_170;
  code *local_168;
  undefined1 local_160;
  undefined1 *local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  undefined1 local_138;
  undefined1 local_f0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  lVar5 = (long)(canonical_values->
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(canonical_values->
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar9._8_4_ = (int)(lVar5 >> 0x23);
  auVar9._0_8_ = lVar6;
  auVar9._12_4_ = 0x45300000;
  local_1021 = immutable_api;
  local_1020 = printer;
  local_1010 = context;
  local_fd0 = descriptor;
  dVar8 = ceil(((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000.0);
  local_1014 = (int)dVar8;
  local_ce0._M_dataplus._M_p = (pointer)&local_ce0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ce0,"classname","");
  puVar1 = (ushort *)(local_fd0->all_names_).payload_;
  local_cb0._0_8_ = ZEXT28(*puVar1);
  local_cb0._8_8_ = (long)puVar1 + ~local_cb0._0_8_;
  io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
            (&local_c68,&local_ce0,(basic_string_view<char,_std::char_traits<char>_> *)local_cb0);
  local_d00._0_8_ = local_d00 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d00,"static","");
  if (local_fd0->containing_type_ == (Descriptor *)0x0) {
    bVar3 = NestedInFileClass(local_fd0,local_1021);
    local_fd8 = " ";
    if (bVar3) {
      local_fd8 = " static ";
    }
  }
  else {
    local_fd8 = " static ";
  }
  io::Printer::Sub::Sub<char_const*>(&local_bb0,(string *)local_d00,&local_fd8);
  local_d20._M_dataplus._M_p = (pointer)&local_d20.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d20,"deprecation","");
  local_cb8 = "";
  if ((local_fd0->options_->field_0)._impl_.deprecated_ != false) {
    local_cb8 = "@java.lang.Deprecated";
  }
  io::Printer::Sub::Sub<char_const*>((Sub *)local_af8,&local_d20,&local_cb8);
  local_d40._M_dataplus._M_p = (pointer)&local_d40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d40,"canonical_values_size","");
  pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                     ((long)(canonical_values->
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(canonical_values->
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3,local_c88);
  local_c98 = (long)pcVar7 - (long)local_c88;
  local_fc0._M_dataplus._M_p = (pointer)&local_fc0.field_2;
  local_c90 = local_c88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fc0,local_c88,pcVar7);
  io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_a40,&local_d40,&local_fc0);
  local_d60._M_dataplus._M_p = (pointer)&local_d60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d60,"proto_enum_class","");
  local_ca0 = "com.google.protobuf.ProtocolMessageEnum";
  if ((local_1010->options_).enforce_lite != false) {
    local_ca0 = "com.google.protobuf.Internal.EnumLite";
  }
  io::Printer::Sub::Sub<char_const*>((Sub *)local_988,&local_d60,&local_ca0);
  local_e00 = &local_df0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e00,"proto_non_null_annotation","");
  local_8d0 = &local_8c0;
  if (local_e00 == &local_df0) {
    uStack_8b8 = uStack_de8;
  }
  else {
    local_8d0 = local_e00;
  }
  _local_8c0 = CONCAT71(uStack_def,local_df0);
  local_8c8 = local_df8;
  local_df8 = 0;
  local_df0 = 0;
  local_e00 = &local_df0;
  local_8b0 = (long *)operator_new(0x18);
  *local_8b0 = (long)&local_1010;
  local_8b0[1] = (long)&local_1020;
  *(undefined1 *)(local_8b0 + 2) = 0;
  local_898 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_8a8 = 0;
  local_8a0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_890 = 1;
  local_888 = local_878;
  local_880 = 0;
  local_878[0] = 0;
  local_868 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_888,0,(char *)0x0,0x53a374);
  local_820 = 0;
  local_e20 = &local_e10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e20,"method_return_null_annotation","");
  local_818 = &local_808;
  if (local_e20 == &local_e10) {
    uStack_800 = uStack_e08;
  }
  else {
    local_818 = local_e20;
  }
  _local_808 = CONCAT71(uStack_e0f,local_e10);
  local_810 = local_e18;
  local_e18 = 0;
  local_e10 = 0;
  local_e20 = &local_e10;
  local_7f8 = (long *)operator_new(0x18);
  *local_7f8 = (long)&local_1010;
  local_7f8[1] = (long)&local_1020;
  *(undefined1 *)(local_7f8 + 2) = 0;
  local_7e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_7f0 = 0;
  local_7e8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_7d8 = 1;
  local_7d0 = local_7c0;
  local_7c8 = 0;
  local_7c0[0] = 0;
  local_7b0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_7d0,0,(char *)0x0,0x53a374);
  local_768 = 0;
  local_e40 = &local_e30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e40,"interface_names","");
  local_760 = local_750;
  if (local_e40 == &local_e30) {
    uStack_748 = uStack_e28;
  }
  else {
    local_760 = local_e40;
  }
  local_758 = local_e38;
  local_e38 = 0;
  local_e30 = 0;
  local_fc8 = printer;
  local_e40 = &local_e30;
  local_740 = (long *)operator_new(0x20);
  *local_740 = (long)&local_1014;
  local_740[1] = (long)&local_fd0;
  local_740[2] = (long)&local_1020;
  *(undefined1 *)(local_740 + 3) = 0;
  local_728 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_738 = 0;
  local_730 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_720 = 1;
  local_718 = local_708;
  local_710 = 0;
  local_708[0] = 0;
  local_6f8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_718,0,(char *)0x0,0x53a374);
  local_6b0 = 0;
  local_e60 = &local_e50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e60,"gen_code_version_validator","");
  local_6a8 = local_698;
  if (local_e60 == &local_e50) {
    uStack_690 = uStack_e48;
  }
  else {
    local_6a8 = local_e60;
  }
  local_6a0 = local_e58;
  local_e58 = 0;
  local_e50 = 0;
  local_e60 = &local_e50;
  local_688 = (long *)operator_new(0x20);
  *local_688 = (long)&local_1010;
  local_688[1] = (long)&local_1020;
  local_688[2] = (long)&local_fd0;
  *(undefined1 *)(local_688 + 3) = 0;
  local_670 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_680 = 0;
  local_678 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_668 = 1;
  local_660 = local_650;
  local_658 = 0;
  local_650[0] = 0;
  local_640 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_660,0,(char *)0x0,0x53a374);
  local_5f8 = 0;
  local_e80 = &local_e70;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e80,"aliases","");
  local_5f0 = local_5e0;
  if (local_e80 == &local_e70) {
    uStack_5d8 = uStack_e68;
  }
  else {
    local_5f0 = local_e80;
  }
  local_5e8 = local_e78;
  local_e78 = 0;
  local_e70 = 0;
  local_e80 = &local_e70;
  local_5d0 = (undefined8 *)operator_new(0x28);
  *local_5d0 = aliases;
  local_5d0[1] = &local_1020;
  local_5d0[2] = &local_1010;
  local_5d0[3] = canonical_values;
  *(undefined1 *)(local_5d0 + 4) = 0;
  local_5b8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_5c8 = 0;
  local_5c0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_5b0 = 1;
  local_5a8 = local_598;
  local_5a0 = 0;
  local_598[0] = 0;
  local_588 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_5a8,0,(char *)0x0,0x53a374);
  local_540 = 0;
  local_ea0 = &local_e90;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea0,"get_number_func","");
  local_538 = local_528;
  if (local_ea0 == &local_e90) {
    uStack_520 = uStack_e88;
  }
  else {
    local_538 = local_ea0;
  }
  local_530 = local_e98;
  local_e98 = 0;
  local_e90 = 0;
  local_ea0 = &local_e90;
  local_518 = (long *)operator_new(0x18);
  *local_518 = (long)&local_fd0;
  local_518[1] = (long)&local_1020;
  *(undefined1 *)(local_518 + 2) = 0;
  local_500 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_510 = 0;
  local_508 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_4f8 = 1;
  local_4f0 = local_4e0;
  local_4e8 = 0;
  local_4e0[0] = 0;
  local_4d0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_4f0,0,(char *)0x0,0x53a374);
  local_488 = 0;
  local_ec0 = &local_eb0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ec0,"deprecated_value_of_func","");
  local_480 = local_470;
  if (local_ec0 == &local_eb0) {
    uStack_468 = uStack_ea8;
  }
  else {
    local_480 = local_ec0;
  }
  local_478 = local_eb8;
  local_eb8 = 0;
  local_eb0 = 0;
  local_ec0 = &local_eb0;
  local_460 = (long *)operator_new(0x18);
  *local_460 = (long)&local_1010;
  local_460[1] = (long)&local_1020;
  *(undefined1 *)(local_460 + 2) = 0;
  local_448 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_458 = 0;
  local_450 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_440 = 1;
  local_438 = local_428;
  local_430 = 0;
  local_428[0] = 0;
  local_418 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_438,0,(char *)0x0,0x53a374);
  local_3d0 = 0;
  local_ee0 = &local_ed0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee0,"for_number_func","");
  local_3c8 = local_3b8;
  if (local_ee0 == &local_ed0) {
    uStack_3b0 = uStack_ec8;
  }
  else {
    local_3c8 = local_ee0;
  }
  local_3c0 = local_ed8;
  local_ed8 = 0;
  local_ed0 = 0;
  local_ee0 = &local_ed0;
  local_3a8 = (long *)operator_new(0x18);
  *local_3a8 = (long)&local_1014;
  local_3a8[1] = (long)&local_1020;
  *(undefined1 *)(local_3a8 + 2) = 0;
  local_390 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_3a0 = 0;
  local_398 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_388 = 1;
  local_380 = local_370;
  local_378 = 0;
  local_370[0] = 0;
  local_360 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_380,0,(char *)0x0,0x53a374);
  local_318 = 0;
  local_f00 = &local_ef0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f00,"value_of_func","");
  local_310 = local_300;
  if (local_f00 == &local_ef0) {
    uStack_2f8 = uStack_ee8;
  }
  else {
    local_310 = local_f00;
  }
  local_308 = local_ef8;
  local_ef8 = 0;
  local_ef0 = 0;
  local_f00 = &local_ef0;
  local_2f0 = (long *)operator_new(0x18);
  *local_2f0 = (long)&local_1014;
  local_2f0[1] = (long)&local_1020;
  *(undefined1 *)(local_2f0 + 2) = 0;
  local_2d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_2e8 = 0;
  local_2e0 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_2d0 = 1;
  local_2c8 = local_2b8;
  local_2c0 = 0;
  local_2b8[0] = 0;
  local_2a8 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_2c8,0,(char *)0x0,0x53a374);
  local_260 = 0;
  local_f20 = &local_f10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f20,"values_func","");
  local_258 = local_248;
  if (local_f20 == &local_f10) {
    uStack_240 = uStack_f08;
  }
  else {
    local_258 = local_f20;
  }
  local_250 = local_f18;
  local_f18 = 0;
  local_f10 = 0;
  local_f20 = &local_f10;
  local_238 = (long *)operator_new(0x20);
  *local_238 = (long)&local_1020;
  local_238[1] = (long)&local_fd0;
  local_238[2] = (long)&local_1014;
  *(undefined1 *)(local_238 + 3) = 0;
  local_220 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_230 = 0;
  local_228 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_218 = 1;
  local_210 = local_200;
  local_208 = 0;
  local_200[0] = 0;
  local_1f0 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_210,0,(char *)0x0,0x53a374);
  local_1a8 = 0;
  local_dc0 = &local_db0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dc0,"enum_verifier_func","");
  local_1a0 = local_190;
  if (local_dc0 == &local_db0) {
    uStack_188 = uStack_da8;
  }
  else {
    local_1a0 = local_dc0;
  }
  local_198 = local_db8;
  local_db8 = 0;
  local_db0 = 0;
  local_dc0 = &local_db0;
  local_180 = (long *)operator_new(0x18);
  *local_180 = (long)&local_1010;
  local_180[1] = (long)&local_1020;
  *(undefined1 *)(local_180 + 2) = 0;
  local_168 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_invoke;
  uStack_178 = 0;
  local_170 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  local_160 = 1;
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  local_138 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x53a374);
  local_f0 = 0;
  local_de0 = &local_dd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_de0,"descriptor_methods","");
  local_e8 = local_d8;
  if (local_de0 == &local_dd0) {
    uStack_d0 = uStack_dc8;
  }
  else {
    local_e8 = local_de0;
  }
  local_e0 = local_dd8;
  local_dd8 = 0;
  local_dd0 = 0;
  local_de0 = &local_dd0;
  local_c8 = (long *)operator_new(0x30);
  *local_c8 = (long)&local_fd0;
  local_c8[1] = (long)&local_1010;
  local_c8[2] = (long)&local_1020;
  local_c8[3] = (long)&name_resolver;
  local_c8[4] = (long)&local_1021;
  *(undefined1 *)(local_c8 + 5) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  uStack_c0 = 0;
  local_b8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_a8 = 1;
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x53a374);
  local_38 = 0;
  io::Printer::Emit(local_fc8,&local_c68,0x11,0x9a7,
                    "\n        $proto_non_null_annotation$\n        $deprecation$\n        public$static$final class $classname$\n          implements $proto_enum_class$, java.io.Serializable, $interface_names$ {\n          static {\n            $gen_code_version_validator$\n          }\n\n          public static final $classname$ UNRECOGNIZED = new $classname$(-1, $canonical_values_size$, \"UNRECOGNIZED\");\n\n          $aliases$\n\n          $deprecated_value_of_func$\n\n          public final int getNumber() {\n            $get_number_func$\n          }\n\n          /**\n           * @param value The numeric wire value of the corresponding enum entry.\n           * @return The enum associated with the given numeric wire value.\n           */\n          $method_return_null_annotation$\n          public static $classname$ forNumber(int value) {\n            $for_number_func$\n          }\n\n          /**\n           * @param name The string name of the corresponding enum entry.\n           * @return The enum associated with the given string name.\n           */\n          public static $classname$ valueOf(String name) {\n            $value_of_func$\n          }\n\n          public static $classname$[] values() {\n            $values_func$\n          }\n\n          private final int value;\n          private final String name;\n          private final int index;\n\n          $classname$(int v, int i, String n) {\n            this.value = v;\n            this.index = i;\n            this.name = n;\n          }\n\n          public int index() {\n            return index;\n          }\n\n          public int value() {\n            return value;\n          }\n\n          public String name() {\n            return name;\n          }\n\n          // For Kotlin code.\n          public String getName() {\n            return name;\n          }\n\n          @java.lang.Override\n          public String toString() {\n            return name;\n          }\n\n          public static com.google.protobuf.Internal.EnumLiteMap<$classname$> internalGetValueMap() {\n            return internalValueMap;\n          }\n\n          p..." /* TRUNCATED STRING LITERAL */
                   );
  lVar5 = 0xc38;
  do {
    if (acStack_c70[lVar5] == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_cb0 + lVar5));
    }
    plVar2 = *(long **)((long)&local_ce0._M_string_length + lVar5);
    if ((long *)(local_ce0.field_2._M_local_buf + lVar5 + 8) != plVar2) {
      operator_delete(plVar2,*(long *)(local_ce0.field_2._M_local_buf + lVar5 + 8) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)&local_ce0._M_dataplus._M_p + lVar5)]._M_data)
              (&local_1001,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_d00 + lVar5));
    *(undefined1 *)((long)&local_ce0._M_dataplus._M_p + lVar5) = 0xff;
    plVar2 = *(long **)((long)&local_d20._M_dataplus._M_p + lVar5);
    if ((long *)(local_d00 + lVar5 + -0x10) != plVar2) {
      operator_delete(plVar2,*(long *)(local_d00 + lVar5 + -0x10) + 1);
    }
    lVar5 = lVar5 + -0xb8;
  } while (lVar5 != 0);
  if (local_de0 != &local_dd0) {
    operator_delete(local_de0,CONCAT71(uStack_dcf,local_dd0) + 1);
  }
  if (local_dc0 != &local_db0) {
    operator_delete(local_dc0,CONCAT71(uStack_daf,local_db0) + 1);
  }
  if (local_f20 != &local_f10) {
    operator_delete(local_f20,CONCAT71(uStack_f0f,local_f10) + 1);
  }
  if (local_f00 != &local_ef0) {
    operator_delete(local_f00,CONCAT71(uStack_eef,local_ef0) + 1);
  }
  if (local_ee0 != &local_ed0) {
    operator_delete(local_ee0,CONCAT71(uStack_ecf,local_ed0) + 1);
  }
  if (local_ec0 != &local_eb0) {
    operator_delete(local_ec0,CONCAT71(uStack_eaf,local_eb0) + 1);
  }
  if (local_ea0 != &local_e90) {
    operator_delete(local_ea0,CONCAT71(uStack_e8f,local_e90) + 1);
  }
  if (local_e80 != &local_e70) {
    operator_delete(local_e80,CONCAT71(uStack_e6f,local_e70) + 1);
  }
  if (local_e60 != &local_e50) {
    operator_delete(local_e60,CONCAT71(uStack_e4f,local_e50) + 1);
  }
  if (local_e40 != &local_e30) {
    operator_delete(local_e40,CONCAT71(uStack_e2f,local_e30) + 1);
  }
  if (local_e20 != &local_e10) {
    operator_delete(local_e20,CONCAT71(uStack_e0f,local_e10) + 1);
  }
  if (local_e00 != &local_df0) {
    operator_delete(local_e00,CONCAT71(uStack_def,local_df0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d60._M_dataplus._M_p != &local_d60.field_2) {
    operator_delete(local_d60._M_dataplus._M_p,local_d60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fc0._M_dataplus._M_p != &local_fc0.field_2) {
    operator_delete(local_fc0._M_dataplus._M_p,local_fc0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d40._M_dataplus._M_p != &local_d40.field_2) {
    operator_delete(local_d40._M_dataplus._M_p,local_d40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d20._M_dataplus._M_p != &local_d20.field_2) {
    operator_delete(local_d20._M_dataplus._M_p,local_d20.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_d00._0_8_ != local_d00 + 0x10) {
    operator_delete((void *)local_d00._0_8_,local_d00._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce0._M_dataplus._M_p != &local_ce0.field_2) {
    operator_delete(local_ce0._M_dataplus._M_p,local_ce0.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_1014) {
    local_fe0 = &local_8d0;
    iVar4 = 0;
    do {
      local_fc8 = (Printer *)CONCAT44(local_fc8._4_4_,iVar4);
      local_fd8 = (char *)CONCAT44(local_fd8._4_4_,iVar4 * 1000);
      local_cc0 = local_1020;
      local_d80._M_dataplus._M_p = (pointer)&local_d80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d80,"classname","");
      puVar1 = (ushort *)(local_fd0->all_names_).payload_;
      local_cb0._0_8_ = ZEXT28(*puVar1);
      local_cb0._8_8_ = (long)puVar1 + ~local_cb0._0_8_;
      io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
                (&local_c68,&local_d80,(basic_string_view<char,_std::char_traits<char>_> *)local_cb0
                );
      local_da0._M_dataplus._M_p = (pointer)&local_da0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_da0,"count","");
      pcVar7 = absl::lts_20250127::numbers_internal::FastIntToBuffer((int32_t)local_fc8,local_c88);
      local_c98 = (long)pcVar7 - (long)local_c88;
      local_fc0._M_dataplus._M_p = (pointer)&local_fc0.field_2;
      local_c90 = local_c88;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fc0,local_c88,pcVar7);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_bb0,&local_da0,&local_fc0);
      local_1000 = &local_ff0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1000,"method_return_null_annotation","");
      local_af8._0_8_ = local_af8 + 0x10;
      if (local_1000 == &local_ff0) {
        local_af8._24_8_ = uStack_fe8;
      }
      else {
        local_af8._0_8_ = local_1000;
      }
      local_af8._17_7_ = uStack_fef;
      local_af8[0x10] = local_ff0;
      local_af8._8_8_ = local_ff8;
      local_ff8 = 0;
      local_ff0 = '\0';
      local_1000 = &local_ff0;
      local_af8._32_8_ = operator_new(0x18);
      *(Context ***)local_af8._32_8_ = &local_1010;
      *(Printer ***)(local_af8._32_8_ + 8) = &local_1020;
      *(undefined1 *)(local_af8._32_8_ + 0x10) = 0;
      local_ac0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_af8._40_8_ = 0;
      local_af8._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_ab8 = '\x01';
      local_ab0._M_p = (pointer)&local_aa0;
      local_aa8 = 0;
      local_aa0._M_local_buf[0] = '\0';
      local_a90 = false;
      std::__cxx11::string::_M_replace((ulong)&local_ab0,0,(char *)0x0,0x53a374);
      local_a48 = false;
      local_f40 = &local_f30;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f40,"enums","");
      local_a40._0_8_ = local_a40 + 0x10;
      if (local_f40 == &local_f30) {
        local_a40._24_8_ = uStack_f28;
      }
      else {
        local_a40._0_8_ = local_f40;
      }
      local_a40._17_7_ = uStack_f2f;
      local_a40[0x10] = local_f30;
      local_a40._8_8_ = local_f38;
      local_f38 = 0;
      local_f30 = '\0';
      local_f40 = &local_f30;
      local_a40._32_8_ = operator_new(0x28);
      *(char ***)local_a40._32_8_ = &local_fd8;
      *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        **)(local_a40._32_8_ + 8) = canonical_values;
      *(Printer ***)(local_a40._32_8_ + 0x10) = &local_1020;
      *(Context ***)(local_a40._32_8_ + 0x18) = &local_1010;
      *(undefined1 *)(local_a40._32_8_ + 0x20) = 0;
      local_a08 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_a40._40_8_ = 0;
      local_a40._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_a00 = '\x01';
      local_9f8._M_p = (pointer)&local_9e8;
      local_9f0 = 0;
      local_9e8._M_local_buf[0] = '\0';
      local_9d8 = false;
      std::__cxx11::string::_M_replace((ulong)&local_9f8,0,(char *)0x0,0x53a374);
      local_990 = false;
      local_f60 = &local_f50;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f60,"value_of_func","");
      local_988._0_8_ = local_988 + 0x10;
      if (local_f60 == &local_f50) {
        local_988._24_8_ = uStack_f48;
      }
      else {
        local_988._0_8_ = local_f60;
      }
      local_988._17_7_ = uStack_f4f;
      local_988[0x10] = local_f50;
      local_988._8_8_ = local_f58;
      local_f58 = 0;
      local_f50 = '\0';
      local_f60 = &local_f50;
      local_988._32_8_ = operator_new(0x20);
      *(Printer ***)local_988._32_8_ = &local_1020;
      *(char ***)(local_988._32_8_ + 8) = &local_fd8;
      *(vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
        **)(local_988._32_8_ + 0x10) = canonical_values;
      *(undefined1 *)(local_988._32_8_ + 0x18) = 0;
      local_950 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      local_988._40_8_ = 0;
      local_988._48_8_ =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
           ::_M_manager;
      local_948 = '\x01';
      local_940._M_p = (pointer)&local_930;
      local_938 = 0;
      local_930._M_local_buf[0] = '\0';
      local_920 = false;
      std::__cxx11::string::_M_replace((ulong)&local_940,0,(char *)0x0,0x53a374);
      local_8d8 = false;
      local_f80 = &local_f70;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f80,"for_number_func","");
      local_8d0 = &local_8c0;
      if (local_f80 == &local_f70) {
        uStack_8b8 = uStack_f68;
      }
      else {
        local_8d0 = local_f80;
      }
      _local_8c0 = CONCAT71(uStack_f6f,local_f70);
      local_8c8 = local_f78;
      local_f78 = 0;
      local_f70 = 0;
      local_f80 = &local_f70;
      local_8b0 = (long *)operator_new(0x20);
      *local_8b0 = (long)&local_1020;
      local_8b0[1] = (long)&local_fd8;
      local_8b0[2] = (long)canonical_values;
      *(undefined1 *)(local_8b0 + 3) = 0;
      local_898 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_8a8 = 0;
      local_8a0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_890 = 1;
      local_888 = local_878;
      local_880 = 0;
      local_878[0] = 0;
      local_868 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_888,0,(char *)0x0,0x53a374);
      local_820 = 0;
      local_fa0 = &local_f90;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_fa0,"values_func","");
      local_818 = &local_808;
      if (local_fa0 == &local_f90) {
        uStack_800 = uStack_f88;
      }
      else {
        local_818 = local_fa0;
      }
      _local_808 = CONCAT71(uStack_f8f,local_f90);
      local_810 = local_f98;
      local_f98 = 0;
      local_f90 = 0;
      local_fa0 = &local_f90;
      local_7f8 = (long *)operator_new(0x20);
      *local_7f8 = (long)&local_1020;
      local_7f8[1] = (long)&local_fd8;
      local_7f8[2] = (long)canonical_values;
      *(undefined1 *)(local_7f8 + 3) = 0;
      local_7e0 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_invoke;
      uStack_7f0 = 0;
      local_7e8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      local_7d8 = 1;
      local_7d0 = local_7c0;
      local_7c8 = 0;
      local_7c0[0] = 0;
      local_7b0 = 0;
      std::__cxx11::string::_M_replace((ulong)&local_7d0,0,(char *)0x0,0x53a374);
      local_768 = 0;
      io::Printer::Emit(local_cc0,&local_c68,7,0x369,
                        "\n          interface $classname$$count$ {\n\n            $enums$\n\n            /**\n             * @param value The numeric wire value of the corresponding enum entry.\n             * @return The enum associated with the given numeric wire value.\n             */\n            $method_return_null_annotation$\n            public static $classname$ forNumber$count$(int value) {\n              $for_number_func$\n            }\n\n            /**\n             * @param name The string name of the corresponding enum entry.\n             * @return The enum associated with the given string name.\n             */\n            $method_return_null_annotation$\n            public static $classname$ valueOf$count$(String name) {\n              $value_of_func$\n            }\n\n            public static $classname$[] values$count$() {\n              $values_func$\n            }\n          }\n        "
                       );
      lVar5 = 0x508;
      do {
        if (acStack_c70[lVar5] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_cb0 + lVar5));
        }
        plVar2 = *(long **)((long)&local_ce0._M_string_length + lVar5);
        if ((long *)(local_ce0.field_2._M_local_buf + lVar5 + 8) != plVar2) {
          operator_delete(plVar2,*(long *)(local_ce0.field_2._M_local_buf + lVar5 + 8) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[*(byte *)((long)&local_ce0._M_dataplus._M_p + lVar5)]._M_data)
                  ((anon_class_1_0_00000001 *)&local_cb8,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_d00 + lVar5));
        *(undefined1 *)((long)&local_ce0._M_dataplus._M_p + lVar5) = 0xff;
        plVar2 = *(long **)((long)&local_d20._M_dataplus._M_p + lVar5);
        if ((long *)(local_d00 + lVar5 + -0x10) != plVar2) {
          operator_delete(plVar2,*(long *)(local_d00 + lVar5 + -0x10) + 1);
        }
        lVar5 = lVar5 + -0xb8;
      } while (lVar5 != 0);
      if (local_fa0 != &local_f90) {
        operator_delete(local_fa0,CONCAT71(uStack_f8f,local_f90) + 1);
      }
      if (local_f80 != &local_f70) {
        operator_delete(local_f80,CONCAT71(uStack_f6f,local_f70) + 1);
      }
      if (local_f60 != &local_f50) {
        operator_delete(local_f60,CONCAT71(uStack_f4f,local_f50) + 1);
      }
      if (local_f40 != &local_f30) {
        operator_delete(local_f40,CONCAT71(uStack_f2f,local_f30) + 1);
      }
      if (local_1000 != &local_ff0) {
        operator_delete(local_1000,CONCAT71(uStack_fef,local_ff0) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_fc0._M_dataplus._M_p != &local_fc0.field_2) {
        operator_delete(local_fc0._M_dataplus._M_p,local_fc0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_da0._M_dataplus._M_p != &local_da0.field_2) {
        operator_delete(local_da0._M_dataplus._M_p,local_da0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d80._M_dataplus._M_p != &local_d80.field_2) {
        operator_delete(local_d80._M_dataplus._M_p,local_d80.field_2._M_allocated_capacity + 1);
      }
      iVar4 = (int32_t)local_fc8 + 1;
    } while (iVar4 < local_1014);
  }
  return;
}

Assistant:

void GenerateLarge(
    io::Printer* printer, const EnumDescriptor* descriptor,
    std::vector<const EnumValueDescriptor*> canonical_values,
    std::vector<
        std::pair<const EnumValueDescriptor*, const EnumValueDescriptor*>>
        aliases,
    bool immutable_api, Context* context, ClassNameResolver* name_resolver) {
  // Max number of constants in a generated Java class.
  constexpr int kMaxEnums = 1000;
  int interface_count = ceil((double)canonical_values.size() / kMaxEnums);

  printer->Emit(
      {{"classname", descriptor->name()},
       {"static", IsOwnFile(descriptor, immutable_api) ? " " : " static "},
       {"deprecation",
        descriptor->options().deprecated() ? "@java.lang.Deprecated" : ""},
       {"canonical_values_size", absl::StrCat(canonical_values.size())},
       {"proto_enum_class", context->EnforceLite()
                                ? "com.google.protobuf.Internal.EnumLite"
                                : "com.google.protobuf.ProtocolMessageEnum"},
       {"proto_non_null_annotation",
        [&] {
          if (!context->options().opensource_runtime) {
            printer->Emit(R"(
              @com.google.protobuf.Internal.ProtoNonnullApi
            )");
          }
        }},
       {"method_return_null_annotation",
        [&] {
          if (!context->options().opensource_runtime) {
            printer->Emit(R"(
              @com.google.protobuf.Internal.ProtoMethodMayReturnNull
            )");
          }
        }},
       {"interface_names",
        [&] {
          std::vector<std::string> interface_names;
          interface_names.reserve(interface_count);
          for (int count = 0; count < interface_count; count++) {
            interface_names.push_back(
                absl::StrFormat("%s%d", descriptor->name(), count));
          }
          printer->Emit(
              {{"interface_names", absl::StrJoin(interface_names, ", ")}},
              R"($interface_names$)");
        }},
       {"gen_code_version_validator",
        [&] {
          if (!context->EnforceLite()) {
            PrintGencodeVersionValidator(printer,
                                         context->options().opensource_runtime,
                                         descriptor->name());
          }
        }},
       {"aliases",
        [&] {
          for (int i = 0; i < aliases.size(); i++) {
            WriteEnumValueDocComment(printer, aliases[i].first,
                                     context->options());
            printer->Emit({{"name", aliases[i].first->name()},
                           {"canonical_name", aliases[i].second->name()}},
                          R"(
                  public static final $classname$ $name$ = $canonical_name$;
                )");
            printer->Annotate("name", canonical_values[i]);
          }
        }},
       {"get_number_func",
        [&] {
          if (!descriptor->is_closed()) {
            printer->Emit(R"(
                if (this == UNRECOGNIZED) {
                  throw new java.lang.IllegalArgumentException(
                    "Can't get the number of an unknown enum value.");
                }
              )");
          }
          printer->Emit(R"(
            return value;
          )");
        }},
       {"deprecated_value_of_func",
        [&] {
          if (context->options().opensource_runtime) {
            printer->Emit(R"(
              /**
               * @param value The numeric wire value of the corresponding enum entry.
               * @return The enum associated with the given numeric wire value.
               * @deprecated Use {@link #forNumber(int)} instead.
               */
              @java.lang.Deprecated
              public static $classname$ valueOf(int value) {
                return forNumber(value);
              }
          )");
          }
        }},
       {"for_number_func",
        [&] {
          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
                if ($classname$$count$.forNumber$count$(value) != null) {
                  return $classname$$count$.forNumber$count$(value);
                }
                )");
          }
          printer->Emit(R"(
                return null;
                )");
        }},
       {"value_of_func",
        [&] {
          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
              if ($classname$$count$.valueOf$count$(name) != null) {
                return $classname$$count$.valueOf$count$(name);
              }
            )");
          }
          printer->Emit(R"(
              throw new java.lang.IllegalArgumentException(
                "No enum constant $classname$." + name);
          )");
        }},
       {"values_func",
        [&] {
          printer->Emit({{"size", absl::StrCat(descriptor->value_count() + 1)}},
                        R"(
              int ordinal = 0;
              $classname$[] values = new $classname$[$size$];
          )");

          for (int count = 0; count < interface_count; count++) {
            printer->Emit({{"count", absl::StrCat(count)}}, R"(
              $classname$[] values$count$ = $classname$$count$.values$count$();
              System.arraycopy(values$count$, 0, values, ordinal, values$count$.length);
              ordinal += values$count$.length;
            )");
          }
          printer->Emit(
              {{"last_index", absl::StrCat(descriptor->value_count())}}, R"(
              values[$last_index$] = UNRECOGNIZED;
              return values;
          )");
        }},
       {"enum_verifier_func",
        [&] {
          if (context->EnforceLite()) {
            printer->Emit(R"(
                public static com.google.protobuf.Internal.EnumVerifier
                    internalGetVerifier() {
                  return $classname$Verifier.INSTANCE;
                }

                private static final class $classname$Verifier implements
                     com.google.protobuf.Internal.EnumVerifier {
                        static final com.google.protobuf.Internal.EnumVerifier
                          INSTANCE = new $classname$Verifier();
                        @java.lang.Override
                        public boolean isInRange(int number) {
                          return $classname$.forNumber(number) != null;
                        }
                      };
            )");
          }
        }},
       {"descriptor_methods",
        [&] {
          // -----------------------------------------------------------------
          // Reflection

          if (HasDescriptorMethods(descriptor, context->EnforceLite())) {
            printer->Print(
                "public final "
                "com.google.protobuf.Descriptors.EnumValueDescriptor\n"
                "    getValueDescriptor() {\n");
            if (!descriptor->is_closed()) {
              printer->Print(
                  "  if (this == UNRECOGNIZED) {\n"
                  "    throw new java.lang.IllegalStateException(\n"
                  "        \"Can't get the descriptor of an unrecognized enum "
                  "value.\");\n"
                  "  }\n");
            }
            printer->Print(
                "  return getDescriptor().getValues().get(index());\n"
                "}\n"
                "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
                "    getDescriptorForType() {\n"
                "  return getDescriptor();\n"
                "}\n"
                "public static final "
                "com.google.protobuf.Descriptors.EnumDescriptor\n"
                "    getDescriptor() {\n");

            // TODO:  Cache statically?  Note that we can't access
            // descriptors
            //   at module init time because it wouldn't work with
            //   descriptor.proto, but we can cache the value the first time
            //   getDescriptor() is called.
            if (descriptor->containing_type() == nullptr) {
              // The class generated for the File fully populates the descriptor
              // with extensions in both the mutable and immutable cases. (In
              // the mutable api this is accomplished by attempting to load the
              // immutable outer class).
              printer->Print(
                  "  return "
                  "$file$.getDescriptor().getEnumTypes().get($index$);\n",
                  "file",
                  name_resolver->GetClassName(descriptor->file(),
                                              immutable_api),
                  "index", absl::StrCat(descriptor->index()));
            } else {
              printer->Print(
                  "  return "
                  "$parent$.$descriptor$.getEnumTypes().get($index$);\n",
                  "parent",
                  name_resolver->GetClassName(descriptor->containing_type(),
                                              immutable_api),
                  "descriptor",
                  descriptor->containing_type()
                          ->options()
                          .no_standard_descriptor_accessor()
                      ? "getDefaultInstance().getDescriptorForType()"
                      : "getDescriptor()",
                  "index", absl::StrCat(descriptor->index()));
            }
            printer->Print(
                "}\n"
                "\n");

            printer->Print(
                "\n"
                "public static $classname$ valueOf(\n"
                "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) "
                "{\n"
                "  if (desc.getType() != getDescriptor()) {\n"
                "    throw new java.lang.IllegalArgumentException(\n"
                "      \"EnumValueDescriptor is not for this type.\");\n"
                "  }\n",
                "classname", descriptor->name());
            if (!descriptor->is_closed()) {
              printer->Print(
                  "  if (desc.getIndex() == -1) {\n"
                  "    return UNRECOGNIZED;\n"
                  "  }\n");
            }
            printer->Print(
                "  return values()[desc.getIndex()];\n"
                "}\n"
                "\n");
          }
        }}},
      R"(
        $proto_non_null_annotation$
        $deprecation$
        public$static$final class $classname$
          implements $proto_enum_class$, java.io.Serializable, $interface_names$ {
          static {
            $gen_code_version_validator$
          }

          public static final $classname$ UNRECOGNIZED = new $classname$(-1, $canonical_values_size$, "UNRECOGNIZED");

          $aliases$

          $deprecated_value_of_func$

          public final int getNumber() {
            $get_number_func$
          }

          /**
           * @param value The numeric wire value of the corresponding enum entry.
           * @return The enum associated with the given numeric wire value.
           */
          $method_return_null_annotation$
          public static $classname$ forNumber(int value) {
            $for_number_func$
          }

          /**
           * @param name The string name of the corresponding enum entry.
           * @return The enum associated with the given string name.
           */
          public static $classname$ valueOf(String name) {
            $value_of_func$
          }

          public static $classname$[] values() {
            $values_func$
          }

          private final int value;
          private final String name;
          private final int index;

          $classname$(int v, int i, String n) {
            this.value = v;
            this.index = i;
            this.name = n;
          }

          public int index() {
            return index;
          }

          public int value() {
            return value;
          }

          public String name() {
            return name;
          }

          // For Kotlin code.
          public String getName() {
            return name;
          }

          @java.lang.Override
          public String toString() {
            return name;
          }

          public static com.google.protobuf.Internal.EnumLiteMap<$classname$> internalGetValueMap() {
            return internalValueMap;
          }

          private static final com.google.protobuf.Internal.EnumLiteMap<
            $classname$> internalValueMap =
              new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {
                public $classname$ findValueByNumber(int number) {
                  return $classname$.forNumber(number);
                }
              };

          $enum_verifier_func$

          $descriptor_methods$
        }

        )");

  for (int count = 0; count < interface_count; count++) {
    int start = count * kMaxEnums;
    printer->Emit(
        {{"classname", descriptor->name()},
         {"count", absl::StrCat(count)},
         {"method_return_null_annotation",
          [&] {
            if (!context->options().opensource_runtime) {
              printer->Emit(R"(
                          @com.google.protobuf.Internal.ProtoMethodMayReturnNull
                        )");
            }
          }},
         {"enums",
          [&] {
            for (int i = start;
                 i < std::min(start + kMaxEnums, (int)canonical_values.size());
                 i++) {
              WriteEnumValueDocComment(printer, canonical_values[i],
                                       context->options());
              printer->Emit(
                  {
                      {"name", canonical_values[i]->name()},
                      {"number", absl::StrCat(canonical_values[i]->number())},
                      {"index", absl::StrCat(canonical_values[i]->index())},
                      {"deprecation",
                       canonical_values[i]->options().deprecated()
                           ? "@java.lang.Deprecated"
                           : ""},
                  },
                  R"(
                    $deprecation$
                    public static final $classname$ $name$ = new $classname$($number$, $index$, "$name$");

                    $deprecation$
                    public static final int $name$_VALUE = $number$;
                  )");
            }
          }},
         {"value_of_func",
          [&] {
            printer->Emit({{"cases",
                            [&] {
                              for (int i = start;
                                   i < std::min(start + kMaxEnums,
                                                (int)canonical_values.size());
                                   i++) {
                                printer->Emit(
                                    {{"name", canonical_values[i]->name()}},
                                    R"(
                                    case "$name$": return $name$;
                                    )");
                              }
                            }}},
                          R"(
                          switch (name) {
                            $cases$
                            default: return null;
                          }
                          )");
          }},
         {"for_number_func",
          [&] {
            printer->Emit(
                {{"cases",
                  [&] {
                    for (int i = start;
                         i < std::min(start + kMaxEnums,
                                      (int)canonical_values.size());
                         i++) {
                      printer->Emit(
                          {{"name", canonical_values[i]->name()},
                           {"number",
                            absl::StrCat(canonical_values[i]->number())}},
                          R"(
                            case $number$: return $name$;
                          )");
                    }
                  }}},
                R"(
                  switch (value) {
                    $cases$
                    default: return null;
                  }
                )");
          }},
         {"values_func",
          [&] {
            printer->Emit({{"values",
                            [&] {
                              std::vector<absl::string_view> values;
                              for (int i = start;
                                   i < std::min(start + kMaxEnums,
                                                (int)canonical_values.size());
                                   i++) {
                                values.push_back(canonical_values[i]->name());
                              }
                              printer->Emit(
                                  {{"values", absl::StrJoin(values, ", ")}},
                                  R"(
                                  $values$
                                  )");
                            }}},
                          R"(
                          return new $classname$[] {
                            $values$
                          };
                          )");
          }}},
        R"(
          interface $classname$$count$ {

            $enums$

            /**
             * @param value The numeric wire value of the corresponding enum entry.
             * @return The enum associated with the given numeric wire value.
             */
            $method_return_null_annotation$
            public static $classname$ forNumber$count$(int value) {
              $for_number_func$
            }

            /**
             * @param name The string name of the corresponding enum entry.
             * @return The enum associated with the given string name.
             */
            $method_return_null_annotation$
            public static $classname$ valueOf$count$(String name) {
              $value_of_func$
            }

            public static $classname$[] values$count$() {
              $values_func$
            }
          }
        )");
  }
}